

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

string_view cinatra::get_chuncked_buffers<false,false>(size_t length,array<char,_24UL> *buffer)

{
  char *pcVar1;
  __integer_to_chars_result_type<unsigned_long> _Var2;
  string_view sVar3;
  
  _Var2 = std::__to_chars_i<unsigned_long>(buffer->_M_elems + 2,buffer->_M_elems + 0x16,length,0x10)
  ;
  pcVar1 = _Var2.ptr;
  pcVar1[0] = '\r';
  pcVar1[1] = '\n';
  sVar3._M_len = pcVar1 + (2 - (long)buffer);
  sVar3._M_str = buffer->_M_elems;
  return sVar3;
}

Assistant:

inline std::string_view get_chuncked_buffers(size_t length,
                                             std::array<char, 24> &buffer) {
  if constexpr (is_last_time) {
    return std::string_view{"\r\n0\r\n\r\n"};
  }
  else {
    auto [ptr, ec] = std::to_chars(
        buffer.data() + 2, buffer.data() + buffer.size() - 2, length, 16);
    *ptr++ = '\r';
    *ptr++ = '\n';
    if constexpr (is_first_time) {
      buffer[0] = '\r';
      buffer[1] = '\n';
      return std::string_view(buffer.data() + 2,
                              std::distance(buffer.data() + 2, ptr));
    }
    else {
      return std::string_view(buffer.data(), std::distance(buffer.data(), ptr));
    }
  }
}